

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crnlib.cpp
# Opt level: O2

bool crn_decompress_block(void *pSrc_block,crn_uint32 *pDst_pixels_u32,crn_format crn_fmt)

{
  uint *pDst;
  uint uVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  crn_format cVar6;
  ulong uVar7;
  uint x;
  uint uVar8;
  uint i;
  uint i_1;
  uint *puVar9;
  ulong uVar10;
  ulong uVar11;
  uint values0 [8];
  uint values1 [8];
  
  cVar6 = crnd::crnd_get_fundamental_dxt_format(crn_fmt);
  bVar2 = false;
  switch(cVar6) {
  case cCRNFmtDXT1:
    crnlib::dxt1_block::get_block_colors
              ((color_quad_u8 *)values0,*pSrc_block,*(uint16 *)((long)pSrc_block + 2));
    bVar3 = 0;
    for (uVar10 = 0; uVar10 != 0x10; uVar10 = uVar10 + 1) {
      pDst_pixels_u32[uVar10] =
           values0[*(byte *)((long)pSrc_block + (uVar10 >> 2 & 0x3fffffff) + 4) >> (bVar3 & 6) & 3];
      bVar3 = bVar3 + 2;
    }
    break;
  case cCRNFmtDXT3:
    crnlib::dxt1_block::get_block_colors
              ((color_quad_u8 *)values0,*(uint16 *)((long)pSrc_block + 8),
               *(uint16 *)((long)pSrc_block + 10));
    for (uVar10 = 0; uVar10 != 0x10; uVar10 = uVar10 + 1) {
      uVar8 = (uint)uVar10 & 3;
      uVar7 = uVar10 >> 2 & 0x3fffffff;
      uVar11 = (ulong)(*(byte *)((long)pSrc_block + uVar7 + 0xc) >> (char)uVar8 * '\x02' & 3);
      uVar5 = crnlib::dxt3_block::get_alpha((dxt3_block *)pSrc_block,uVar8,(uint)uVar7,true);
      *(char *)(pDst_pixels_u32 + uVar10) = (char)values0[uVar11];
      *(undefined1 *)((long)pDst_pixels_u32 + uVar10 * 4 + 1) =
           *(undefined1 *)((long)values0 + uVar11 * 4 + 1);
      *(undefined1 *)((long)pDst_pixels_u32 + uVar10 * 4 + 2) =
           *(undefined1 *)((long)values0 + uVar11 * 4 + 2);
      *(char *)((long)pDst_pixels_u32 + uVar10 * 4 + 3) = (char)uVar5;
    }
    break;
  case cCRNFmtDXT5:
    crnlib::dxt1_block::get_block_colors
              ((color_quad_u8 *)values1,*(uint16 *)((long)pSrc_block + 8),
               *(uint16 *)((long)pSrc_block + 10));
    crnlib::dxt5_block::get_block_values
              (values0,(uint)*pSrc_block,(uint)*(byte *)((long)pSrc_block + 1));
    for (uVar10 = 0; uVar10 != 0x10; uVar10 = uVar10 + 1) {
      uVar8 = (uint)uVar10 & 3;
      uVar7 = uVar10 >> 2 & 0x3fffffff;
      uVar11 = (ulong)(*(byte *)((long)pSrc_block + uVar7 + 0xc) >> (char)uVar8 * '\x02' & 3);
      uVar5 = crnlib::dxt5_block::get_selector((dxt5_block *)pSrc_block,uVar8,(uint)uVar7);
      *(char *)(pDst_pixels_u32 + uVar10) = (char)values1[uVar11];
      *(undefined1 *)((long)pDst_pixels_u32 + uVar10 * 4 + 1) =
           *(undefined1 *)((long)values1 + uVar11 * 4 + 1);
      *(undefined1 *)((long)pDst_pixels_u32 + uVar10 * 4 + 2) =
           *(undefined1 *)((long)values1 + uVar11 * 4 + 2);
      *(char *)((long)pDst_pixels_u32 + uVar10 * 4 + 3) = (char)values0[uVar5];
    }
  case cCRNFmtDXN_XY:
  case cCRNFmtDXN_YX:
    pDst = values0;
    crnlib::dxt5_block::get_block_values
              (pDst,(uint)*pSrc_block,(uint)*(byte *)((long)pSrc_block + 1));
    crnlib::dxt5_block::get_block_values
              (values1,(uint)*(byte *)((long)pSrc_block + 8),(uint)*(byte *)((long)pSrc_block + 9));
    puVar9 = values1;
    if (crn_fmt != cCRNFmtDXN_XY) {
      puVar9 = pDst;
      pDst = values1;
    }
    for (uVar10 = 0; uVar10 != 0x10; uVar10 = uVar10 + 1) {
      x = (uint)uVar10 & 3;
      uVar8 = (uint)(uVar10 >> 2) & 0x3fffffff;
      uVar4 = crnlib::dxt5_block::get_selector((dxt5_block *)pSrc_block,x,uVar8);
      uVar5 = crnlib::dxt5_block::get_selector((dxt5_block *)((long)pSrc_block + 8),x,uVar8);
      uVar8 = uVar5;
      if (crn_fmt == cCRNFmtDXN_XY) {
        uVar8 = uVar4;
      }
      if (crn_fmt == cCRNFmtDXN_XY) {
        uVar4 = uVar5;
      }
      uVar5 = puVar9[uVar4];
      *(char *)(pDst_pixels_u32 + uVar10) = (char)pDst[uVar8];
      *(char *)((long)pDst_pixels_u32 + uVar10 * 4 + 1) = (char)uVar5;
      *(undefined2 *)((long)pDst_pixels_u32 + uVar10 * 4 + 2) = 0xffff;
    }
    break;
  default:
    goto switchD_0013a6f3_caseD_3;
  case cCRNFmtDXT5A:
    crnlib::dxt5_block::get_block_values
              (values0,(uint)*pSrc_block,(uint)*(byte *)((long)pSrc_block + 1));
    for (uVar10 = 0; uVar10 != 0x10; uVar10 = uVar10 + 1) {
      uVar5 = crnlib::dxt5_block::get_selector
                        ((dxt5_block *)pSrc_block,(uint)uVar10 & 3,(uint)(uVar10 >> 2) & 0x3fffffff)
      ;
      uVar1 = values0[uVar5];
      *(undefined1 *)(pDst_pixels_u32 + uVar10) = 0xff;
      *(undefined2 *)((long)pDst_pixels_u32 + uVar10 * 4 + 1) = 0xffff;
      *(char *)((long)pDst_pixels_u32 + uVar10 * 4 + 3) = (char)uVar1;
    }
    break;
  case cCRNFmtETC1:
    crnlib::unpack_etc1((etc1_block *)pSrc_block,(color_quad_u8 *)pDst_pixels_u32,false);
  }
  bVar2 = true;
switchD_0013a6f3_caseD_3:
  return bVar2;
}

Assistant:

bool crn_decompress_block(const void* pSrc_block, crn_uint32* pDst_pixels_u32, crn_format crn_fmt)
{
    color_quad_u8* pDst_pixels = reinterpret_cast<color_quad_u8*>(pDst_pixels_u32);

    switch (crn_get_fundamental_dxt_format(crn_fmt))
    {
    case cCRNFmtETC1:
    {
        const etc1_block& block = *reinterpret_cast<const etc1_block*>(pSrc_block);
        unpack_etc1(block, pDst_pixels, false);
        break;
    }
    case cCRNFmtDXT1:
    {
        const dxt1_block* pDXT1_block = reinterpret_cast<const dxt1_block*>(pSrc_block);

        color_quad_u8 colors[cDXT1SelectorValues];
        pDXT1_block->get_block_colors(colors, static_cast<uint16>(pDXT1_block->get_low_color()), static_cast<uint16>(pDXT1_block->get_high_color()));

        for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
        {
            const uint s = pDXT1_block->get_selector(i & 3, i >> 2);

            pDst_pixels[i] = colors[s];
        }

        break;
    }

    case cCRNFmtDXT3:
    {
        const dxt3_block* pDXT3_block = reinterpret_cast<const dxt3_block*>(pSrc_block);

        const dxt1_block* pDXT1_block = reinterpret_cast<const dxt1_block*>(pSrc_block) + 1;
        color_quad_u8 colors[cDXT1SelectorValues];
        pDXT1_block->get_block_colors(colors, static_cast<uint16>(pDXT1_block->get_low_color()), static_cast<uint16>(pDXT1_block->get_high_color()));

        for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
        {
            const uint s = pDXT1_block->get_selector(i & 3, i >> 2);
            const uint a = pDXT3_block->get_alpha(i & 3, i >> 2, true);

            pDst_pixels[i] = colors[s];
            pDst_pixels[i].a = static_cast<uint8>(a);
        }

        break;
    }

    case cCRNFmtDXT5:
    {
        const dxt5_block* pDXT5_block = reinterpret_cast<const dxt5_block*>(pSrc_block);

        const dxt1_block* pDXT1_block = reinterpret_cast<const dxt1_block*>(pSrc_block) + 1;
        color_quad_u8 colors[cDXT1SelectorValues];
        pDXT1_block->get_block_colors(colors, static_cast<uint16>(pDXT1_block->get_low_color()), static_cast<uint16>(pDXT1_block->get_high_color()));

        uint values[cDXT5SelectorValues];
        dxt5_block::get_block_values(values, pDXT5_block->get_low_alpha(), pDXT5_block->get_high_alpha());

        for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
        {
            const uint s = pDXT1_block->get_selector(i & 3, i >> 2);
            const uint a = pDXT5_block->get_selector(i & 3, i >> 2);

            pDst_pixels[i] = colors[s];
            pDst_pixels[i].a = static_cast<uint8>(values[a]);
        }
    }

    case cCRNFmtDXN_XY:
    case cCRNFmtDXN_YX:
    {
        const dxt5_block* pDXT5_block0 = reinterpret_cast<const dxt5_block*>(pSrc_block);
        const dxt5_block* pDXT5_block1 = reinterpret_cast<const dxt5_block*>(pSrc_block) + 1;

        uint values0[cDXT5SelectorValues];
        dxt5_block::get_block_values(values0, pDXT5_block0->get_low_alpha(), pDXT5_block0->get_high_alpha());

        uint values1[cDXT5SelectorValues];
        dxt5_block::get_block_values(values1, pDXT5_block1->get_low_alpha(), pDXT5_block1->get_high_alpha());

        for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
        {
            const uint s0 = pDXT5_block0->get_selector(i & 3, i >> 2);
            const uint s1 = pDXT5_block1->get_selector(i & 3, i >> 2);

            if (crn_fmt == cCRNFmtDXN_XY)
            {
                pDst_pixels[i].set_noclamp_rgba(values0[s0], values1[s1], 255, 255);
            }
            else
            {
                pDst_pixels[i].set_noclamp_rgba(values1[s1], values0[s0], 255, 255);
            }
        }
        
        break;
    }

    case cCRNFmtDXT5A:
    {
        const dxt5_block* pDXT5_block = reinterpret_cast<const dxt5_block*>(pSrc_block);

        uint values[cDXT5SelectorValues];
        dxt5_block::get_block_values(values, pDXT5_block->get_low_alpha(), pDXT5_block->get_high_alpha());

        for (uint i = 0; i < cDXTBlockSize * cDXTBlockSize; i++)
        {
            const uint s = pDXT5_block->get_selector(i & 3, i >> 2);

            pDst_pixels[i].set_noclamp_rgba(255, 255, 255, values[s]);
        }

        break;
    }
    default:
    {
        return false;
    }
    }

    return true;
}